

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkheader.c
# Opt level: O2

ktx_error_code_e ktxCheckHeader2_(KTX_header2 *pHeader,KTX_supplemental_info *pSuppInfo)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ktx_uint32_t kVar4;
  _Bool _Var5;
  int iVar6;
  uint uVar7;
  byte bVar8;
  ktx_error_code_e kVar9;
  
  if ((pHeader == (KTX_header2 *)0x0) || (pSuppInfo == (KTX_supplemental_info *)0x0)) {
    __assert_fail("pHeader != NULL && pSuppInfo != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/checkheader.c"
                  ,0xbe,"ktx_error_code_e ktxCheckHeader2_(KTX_header2 *, KTX_supplemental_info *)")
    ;
  }
  iVar6 = bcmp(pHeader,&DAT_002f6a40,0xc);
  if (iVar6 != 0) {
    return KTX_UNKNOWN_FILE_FORMAT;
  }
  _Var5 = isProhibitedFormat(pHeader->vkFormat);
  if (_Var5) {
    return KTX_FILE_DATA_ERROR;
  }
  _Var5 = isValidFormat(pHeader->vkFormat);
  if (!_Var5) {
    return KTX_UNSUPPORTED_FEATURE;
  }
  uVar1 = pHeader->supercompressionScheme;
  if ((uVar1 == 1) && (pHeader->vkFormat != 0)) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar2 = pHeader->pixelWidth;
  if (uVar2 == 0) {
    return KTX_FILE_DATA_ERROR;
  }
  uVar7 = pHeader->pixelHeight;
  uVar3 = pHeader->pixelDepth;
  if (uVar3 == 0) {
    if (uVar7 != 0) {
      pSuppInfo->textureDimension = 2;
      bVar8 = 1;
      goto LAB_001e6f60;
    }
    pSuppInfo->textureDimension = 1;
    uVar7 = 0;
  }
  else {
    if (uVar7 == 0) {
      return KTX_FILE_DATA_ERROR;
    }
    if (pHeader->layerCount != 0) {
      return KTX_UNSUPPORTED_FEATURE;
    }
    pSuppInfo->textureDimension = 3;
  }
  bVar8 = 0;
LAB_001e6f60:
  if ((pHeader->faceCount == 1) ||
     ((kVar9 = KTX_FILE_DATA_ERROR, pHeader->faceCount == 6 &&
      ((bool)(uVar2 == uVar7 & uVar3 == 0 & bVar8))))) {
    kVar4 = pHeader->levelCount;
    if (kVar4 == 0) {
      pHeader->levelCount = 1;
      bVar8 = 0;
    }
    else {
      bVar8 = (char)kVar4 - 1;
    }
    pSuppInfo->generateMipmaps = kVar4 == 0;
    kVar9 = KTX_UNSUPPORTED_FEATURE;
    if (uVar1 < 4) {
      if (uVar7 < uVar2) {
        uVar7 = uVar2;
      }
      if (uVar7 <= uVar3) {
        uVar7 = uVar3;
      }
      kVar9 = (ktx_error_code_e)(uVar7 >> (bVar8 & 0x1f) == 0);
    }
  }
  return kVar9;
}

Assistant:

KTX_error_code ktxCheckHeader2_(KTX_header2* pHeader,
                                KTX_supplemental_info* pSuppInfo)
{
// supp info is compressed, generateMipmaps and num dimensions. Don't need
// compressed as formatSize gives us that. I think the other 2 aren't needed.
    ktx_uint8_t identifier_reference[12] = KTX2_IDENTIFIER_REF;

    assert(pHeader != NULL && pSuppInfo != NULL);
    ktx_uint32_t max_dim;

    /* Compare identifier, is this a KTX file? */
    if (memcmp(pHeader->identifier, identifier_reference, 12) != 0)
    {
        return KTX_UNKNOWN_FILE_FORMAT;
    }

    /* Check format */
    if (isProhibitedFormat(pHeader->vkFormat))
    {
        return KTX_FILE_DATA_ERROR;
    }
    if (!isValidFormat(pHeader->vkFormat))
    {
        return KTX_UNSUPPORTED_FEATURE;
    }
    if (pHeader->supercompressionScheme == KTX_SS_BASIS_LZ && pHeader->vkFormat != VK_FORMAT_UNDEFINED)
    {
        return KTX_FILE_DATA_ERROR;
    }

    /* Check texture dimensions. KTX files can store 8 types of textures:
       1D, 2D, 3D, cube, and array variants of these. There is currently
       no extension for 3D array textures in any 3D API. */
    if ((pHeader->pixelWidth == 0) ||
        (pHeader->pixelDepth > 0 && pHeader->pixelHeight == 0))
    {
        /* texture must have width */
        /* texture must have height if it has depth */
        return KTX_FILE_DATA_ERROR;
    }

    if (pHeader->pixelDepth > 0)
    {
        if (pHeader->layerCount > 0)
        {
            /* No 3D array textures yet. */
            return KTX_UNSUPPORTED_FEATURE;
        }
        pSuppInfo->textureDimension = 3;
    }
    else if (pHeader->pixelHeight > 0)
    {
        pSuppInfo->textureDimension = 2;
    }
    else
    {
        pSuppInfo->textureDimension = 1;
    }

    if (pHeader->faceCount == 6)
    {
        if (pSuppInfo->textureDimension != 2)
        {
            /* cube map needs 2D faces */
            return KTX_FILE_DATA_ERROR;
        }
        if (pHeader->pixelDepth != 0)
        {
            /* cube map cannot have depth */
            return KTX_FILE_DATA_ERROR;
        }
        if (pHeader->pixelWidth != pHeader->pixelHeight)
        {
            /* cube map needs square faces */
            return KTX_FILE_DATA_ERROR;
        }
    }
    else if (pHeader->faceCount != 1)
    {
        /* numberOfFaces must be either 1 or 6 */
        return KTX_FILE_DATA_ERROR;
    }

    // Check number of mipmap levels
    if (pHeader->levelCount == 0)
    {
        pSuppInfo->generateMipmaps = 1;
        pHeader->levelCount = 1;
    }
    else
    {
        pSuppInfo->generateMipmaps = 0;
    }

    // Check supercompression
    switch (pHeader->supercompressionScheme) {
      case KTX_SS_NONE:
      case KTX_SS_BASIS_LZ:
      case KTX_SS_ZSTD:
      case KTX_SS_ZLIB:
        break;
      default:
        // Unsupported supercompression
        return KTX_UNSUPPORTED_FEATURE;
    }

    // This test works for arrays too because height or depth will be 0.
    max_dim = MAX(MAX(pHeader->pixelWidth, pHeader->pixelHeight), pHeader->pixelDepth);
    if (max_dim < ((ktx_uint32_t)1 << (pHeader->levelCount - 1)))
    {
        // Can't have more mip levels than 1 + log2(max(width, height, depth))
        return KTX_FILE_DATA_ERROR;
    }

    return KTX_SUCCESS;

}